

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O2

void __thiscall
pbrt::DisplayItem::DisplayItem
          (DisplayItem *this,string *baseTitle,Point2i resolution,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *channelNames,
          function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *getTileValues)

{
  ImageChannelBuffer *this_00;
  pointer pbVar1;
  pointer channelName;
  undefined1 local_74 [4];
  ImageChannelBuffer local_70;
  
  this->openedImage = false;
  (this->title)._M_dataplus._M_p = (pointer)&(this->title).field_2;
  (this->title)._M_string_length = 0;
  (this->title).field_2._M_local_buf[0] = '\0';
  (this->resolution).super_Tuple2<pbrt::Point2,_int>.x =
       resolution.super_Tuple2<pbrt::Point2,_int>.x;
  (this->resolution).super_Tuple2<pbrt::Point2,_int>.y =
       resolution.super_Tuple2<pbrt::Point2,_int>.y;
  std::function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)>::function
            (&this->getTileValues,getTileValues);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->channelNames,channelNames);
  (this->channelBuffers).
  super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->channelBuffers).
  super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->channelBuffers).
  super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_74 = (undefined1  [4])getpid();
  StringPrintf<std::__cxx11::string_const&,int>
            ((string *)(local_74 + 4),(pbrt *)"%s (%d)",(char *)baseTitle,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_74,
             (int *)getTileValues);
  this_00 = (ImageChannelBuffer *)(local_74 + 4);
  std::__cxx11::string::operator=((string *)&this->title,(string *)this_00);
  std::__cxx11::string::~string((string *)this_00);
  pbVar1 = (channelNames->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (channelName = (channelNames->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; channelName != pbVar1;
      channelName = channelName + 1) {
    ImageChannelBuffer::ImageChannelBuffer
              (this_00,channelName,
               ((resolution.super_Tuple2<pbrt::Point2,_int>.y + 0x7f) / 0x80) *
               ((resolution.super_Tuple2<pbrt::Point2,_int>.x + 0x7f) / 0x80),&this->title);
    std::
    vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
    ::emplace_back<pbrt::DisplayItem::ImageChannelBuffer>(&this->channelBuffers,this_00);
    ImageChannelBuffer::~ImageChannelBuffer(this_00);
  }
  return;
}

Assistant:

DisplayItem::DisplayItem(
    const std::string &baseTitle, Point2i resolution,
    std::vector<std::string> channelNames,
    std::function<void(Bounds2i b, pstd::span<pstd::span<Float>>)> getTileValues)
    : resolution(resolution), getTileValues(getTileValues), channelNames(channelNames) {
#ifdef PBRT_IS_WINDOWS
    title = StringPrintf("%s (%d)", baseTitle, GetCurrentThreadId());
#else
    title = StringPrintf("%s (%d)", baseTitle, getpid());
#endif

    int nTiles = ((resolution.x + tileSize - 1) / tileSize) *
                 ((resolution.y + tileSize - 1) / tileSize);

    for (const std::string &channelName : channelNames)
        channelBuffers.push_back(ImageChannelBuffer(channelName, nTiles, title));
}